

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

void __thiscall wabt::interp::Thread::Thread(Thread *this,Store *store,Options *options)

{
  Thread *local_30;
  unique_ptr<wabt::interp::Thread::TraceSource,_std::default_delete<wabt::interp::Thread::TraceSource>_>
  local_28;
  Options *local_20;
  Options *options_local;
  Store *store_local;
  Thread *this_local;
  
  local_20 = options;
  options_local = (Options *)store;
  store_local = (Store *)this;
  Object::Object(&this->super_Object,Thread);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Thread_003023a0;
  std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::vector(&this->frames_);
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::vector(&this->values_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->refs_);
  this->store_ = (Store *)options_local;
  this->inst_ = (Instance *)0x0;
  this->mod_ = (Module *)0x0;
  std::
  unique_ptr<wabt::interp::Thread::TraceSource,std::default_delete<wabt::interp::Thread::TraceSource>>
  ::unique_ptr<std::default_delete<wabt::interp::Thread::TraceSource>,void>
            ((unique_ptr<wabt::interp::Thread::TraceSource,std::default_delete<wabt::interp::Thread::TraceSource>>
              *)&this->trace_source_);
  std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::reserve
            (&this->frames_,(ulong)local_20->call_stack_size);
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::reserve
            (&this->values_,(ulong)local_20->value_stack_size);
  this->trace_stream_ = local_20->trace_stream;
  if (local_20->trace_stream != (Stream *)0x0) {
    local_30 = this;
    MakeUnique<wabt::interp::Thread::TraceSource,wabt::interp::Thread*>((wabt *)&local_28,&local_30)
    ;
    std::
    unique_ptr<wabt::interp::Thread::TraceSource,_std::default_delete<wabt::interp::Thread::TraceSource>_>
    ::operator=(&this->trace_source_,&local_28);
    std::
    unique_ptr<wabt::interp::Thread::TraceSource,_std::default_delete<wabt::interp::Thread::TraceSource>_>
    ::~unique_ptr(&local_28);
  }
  return;
}

Assistant:

Thread::Thread(Store& store, const Options& options)
    : Object(skind), store_(store) {
  frames_.reserve(options.call_stack_size);
  values_.reserve(options.value_stack_size);
  trace_stream_ = options.trace_stream;
  if (options.trace_stream) {
    trace_source_ = MakeUnique<TraceSource>(this);
  }
}